

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O0

void cinatra::finish<void>(sha1_context *ctx,void *digest)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 *puVar3;
  long in_RSI;
  ulong *in_RDI;
  uint8_t *d;
  size_t i_1;
  size_t i;
  uint32_t block [16];
  size_t buflen;
  uint64_t total_bits;
  ulong local_78;
  ulong local_70;
  uint32_t *in_stack_ffffffffffffff98;
  uint32_t *in_stack_ffffffffffffffa0;
  
  uVar1 = *in_RDI;
  *in_RDI = uVar1 + 1;
  *(undefined1 *)((long)in_RDI + uVar1 + 0x24) = 0x80;
  uVar1 = *in_RDI;
  while (*in_RDI < 0x40) {
    uVar2 = *in_RDI;
    *in_RDI = uVar2 + 1;
    *(undefined1 *)((long)in_RDI + uVar2 + 0x24) = 0;
  }
  sha1::make_block((uint8_t *)((long)in_RDI + 0x24),(uint32_t *)&stack0xffffffffffffff98);
  if (0x38 < uVar1) {
    sha1::transform<void>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    for (local_70 = 0; local_70 < 0xe; local_70 = local_70 + 1) {
      *(undefined4 *)(&stack0xffffffffffffff98 + local_70 * 4) = 0;
    }
  }
  sha1::transform<void>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  for (local_78 = 0; local_78 < 5; local_78 = local_78 + 1) {
    puVar3 = (undefined1 *)(in_RSI + local_78 * 4);
    puVar3[3] = (char)*(undefined4 *)((long)in_RDI + local_78 * 4 + 0x10);
    puVar3[2] = (char)((uint)*(undefined4 *)((long)in_RDI + local_78 * 4 + 0x10) >> 8);
    puVar3[1] = (char)((uint)*(undefined4 *)((long)in_RDI + local_78 * 4 + 0x10) >> 0x10);
    *puVar3 = (char)((uint)*(undefined4 *)((long)in_RDI + local_78 * 4 + 0x10) >> 0x18);
  }
  return;
}

Assistant:

inline void finish(sha1_context &ctx, void *digest) noexcept {
  using sha1::BLOCK_BYTES;
  using sha1::BLOCK_INTS;

  std::uint64_t total_bits = (ctx.blocks * 64 + ctx.buflen) * 8;
  // pad
  ctx.buf[ctx.buflen++] = 0x80;
  auto const buflen = ctx.buflen;
  while (ctx.buflen < 64) ctx.buf[ctx.buflen++] = 0x00;
  std::uint32_t block[BLOCK_INTS];
  sha1::make_block(ctx.buf, block);
  if (buflen > BLOCK_BYTES - 8) {
    sha1::transform(ctx.digest, block);
    for (size_t i = 0; i < BLOCK_INTS - 2; i++) block[i] = 0;
  }

  /* Append total_bits, split this uint64_t into two uint32_t */
  block[BLOCK_INTS - 1] = total_bits & 0xffffffff;
  block[BLOCK_INTS - 2] = (total_bits >> 32);
  sha1::transform(ctx.digest, block);
  for (std::size_t i = 0; i < sha1::DIGEST_BYTES / 4; i++) {
    std::uint8_t *d = reinterpret_cast<std::uint8_t *>(digest) + 4 * i;
    d[3] = ctx.digest[i] & 0xff;
    d[2] = (ctx.digest[i] >> 8) & 0xff;
    d[1] = (ctx.digest[i] >> 16) & 0xff;
    d[0] = (ctx.digest[i] >> 24) & 0xff;
  }
}